

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

string * GetTxnOutputType_abi_cxx11_(TxoutType t)

{
  undefined4 in_ESI;
  string *in_RDI;
  long in_FS_OFFSET;
  allocator<char> *in_stack_ffffffffffffff88;
  allocator<char> *paVar1;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  undefined1 local_b [2];
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator(&local_9);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator(&local_f);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)(local_b + 1));
    break;
  case 3:
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)local_b);
    break;
  case 4:
    paVar1 = &local_c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,(char *)paVar1,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator(&local_c);
    break;
  case 5:
    paVar1 = &local_d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,paVar1);
    std::allocator<char>::~allocator(&local_d);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator(&local_e);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator(&local_11);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator(&local_10);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator(&local_12);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator(&local_13);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/solver.cpp"
                  ,0x21,"std::string GetTxnOutputType(TxoutType)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string GetTxnOutputType(TxoutType t)
{
    switch (t) {
    case TxoutType::NONSTANDARD: return "nonstandard";
    case TxoutType::PUBKEY: return "pubkey";
    case TxoutType::PUBKEYHASH: return "pubkeyhash";
    case TxoutType::SCRIPTHASH: return "scripthash";
    case TxoutType::MULTISIG: return "multisig";
    case TxoutType::NULL_DATA: return "nulldata";
    case TxoutType::ANCHOR: return "anchor";
    case TxoutType::WITNESS_V0_KEYHASH: return "witness_v0_keyhash";
    case TxoutType::WITNESS_V0_SCRIPTHASH: return "witness_v0_scripthash";
    case TxoutType::WITNESS_V1_TAPROOT: return "witness_v1_taproot";
    case TxoutType::WITNESS_UNKNOWN: return "witness_unknown";
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}